

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_operator.cpp
# Opt level: O0

OperatorResultType __thiscall
duckdb::CachingPhysicalOperator::Execute
          (CachingPhysicalOperator *this,ExecutionContext *context,DataChunk *input,DataChunk *chunk
          ,GlobalOperatorState *gstate,OperatorState *state_p)

{
  OperatorResultType OVar1;
  bool bVar2;
  CachingOperatorState *pCVar3;
  idx_t iVar4;
  pointer this_00;
  DataChunk *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  DataChunk *in_RDI;
  undefined8 in_R8;
  idx_t in_stack_00000020;
  SelectionVector *in_stack_00000028;
  bool in_stack_00000037;
  DataChunk *in_stack_00000038;
  DataChunk *in_stack_00000040;
  OperatorResultType child_result;
  CachingOperatorState *state;
  DataChunk *in_stack_ffffffffffffff18;
  OperatorState *in_stack_ffffffffffffff20;
  bool local_99;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff70;
  Allocator *in_stack_ffffffffffffff78;
  DataChunk *in_stack_ffffffffffffff80;
  
  pCVar3 = OperatorState::Cast<duckdb::CachingOperatorState>(in_stack_ffffffffffffff20);
  OVar1 = (**(code **)&(((ClientContext *)
                        (in_RDI->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                        .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                        .super__Vector_impl_data._M_start)->config).explain_output_type)
                    (in_RDI,in_RSI,in_RDX,in_RCX,in_R8,pCVar3);
  if ((pCVar3->initialized & 1U) == 0) {
    pCVar3->initialized = true;
    local_99 = false;
    if (((ulong)in_RDI[2].data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                super__Vector_impl_data._M_start & 1) != 0) {
      local_99 = PhysicalOperator::OperatorCachingAllowed((ExecutionContext *)in_RDI);
    }
    pCVar3->can_cache_chunk = local_99;
  }
  if (((pCVar3->can_cache_chunk & 1U) != 0) && (iVar4 = DataChunk::size(in_RCX), iVar4 < 0x40)) {
    bVar2 = ::std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_> *)
                       0x7a06e0);
    if (!bVar2) {
      make_uniq<duckdb::DataChunk>();
      unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator=
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 in_stack_ffffffffffffff20,
                 (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 in_stack_ffffffffffffff18);
      unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::~unique_ptr
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 0x7a071a);
      unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 in_stack_ffffffffffffff20);
      Allocator::Get((ClientContext *)0x7a0740);
      DataChunk::GetTypes(in_RDI);
      DataChunk::Initialize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (idx_t)in_RDI);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7a0787);
    }
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
               in_stack_ffffffffffffff20);
    DataChunk::Append(in_stack_00000040,in_stack_00000038,in_stack_00000037,in_stack_00000028,
                      in_stack_00000020);
    this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                          *)in_stack_ffffffffffffff20);
    iVar4 = DataChunk::size(this_00);
    if ((iVar4 < 0x7c0) && (OVar1 != FINISHED)) {
      DataChunk::Reset(in_stack_ffffffffffffff80);
    }
    else {
      unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 in_RCX);
      DataChunk::Move(in_RCX,in_stack_ffffffffffffff18);
      unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
                ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)
                 in_RCX);
      Allocator::Get((ClientContext *)0x7a0854);
      DataChunk::GetTypes(in_RDI);
      DataChunk::Initialize
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                 (idx_t)in_RDI);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x7a0895);
    }
  }
  return OVar1;
}

Assistant:

OperatorResultType CachingPhysicalOperator::Execute(ExecutionContext &context, DataChunk &input, DataChunk &chunk,
                                                    GlobalOperatorState &gstate, OperatorState &state_p) const {
	auto &state = state_p.Cast<CachingOperatorState>();

	// Execute child operator
	auto child_result = ExecuteInternal(context, input, chunk, gstate, state);

#if STANDARD_VECTOR_SIZE >= 128
	if (!state.initialized) {
		state.initialized = true;
		state.can_cache_chunk = caching_supported && PhysicalOperator::OperatorCachingAllowed(context);
	}
	if (!state.can_cache_chunk) {
		return child_result;
	}
	// TODO chunk size of 0 should not result in a cache being created!
	if (chunk.size() < CACHE_THRESHOLD) {
		// we have filtered out a significant amount of tuples
		// add this chunk to the cache and continue

		if (!state.cached_chunk) {
			state.cached_chunk = make_uniq<DataChunk>();
			state.cached_chunk->Initialize(Allocator::Get(context.client), chunk.GetTypes());
		}

		state.cached_chunk->Append(chunk);

		if (state.cached_chunk->size() >= (STANDARD_VECTOR_SIZE - CACHE_THRESHOLD) ||
		    child_result == OperatorResultType::FINISHED) {
			// chunk cache full: return it
			chunk.Move(*state.cached_chunk);
			state.cached_chunk->Initialize(Allocator::Get(context.client), chunk.GetTypes());
			return child_result;
		} else {
			// chunk cache not full return empty result
			chunk.Reset();
		}
	}
#endif

	return child_result;
}